

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.c
# Opt level: O3

int stlma_(double *x,int *n,int *len,double *ave)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  double dVar4;
  
  iVar1 = *n;
  uVar2 = *len;
  dVar4 = 0.0;
  if (0 < (int)uVar2) {
    uVar3 = 0;
    do {
      dVar4 = dVar4 + x[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  *ave = dVar4 / (double)(int)uVar2;
  if (0 < (int)(iVar1 - uVar2)) {
    uVar3 = 0;
    do {
      dVar4 = (dVar4 - x[uVar3]) + x[(long)(int)uVar2 + uVar3];
      ave[uVar3 + 1] = dVar4 / (double)(int)uVar2;
      uVar3 = uVar3 + 1;
    } while (iVar1 - uVar2 != uVar3);
  }
  return 0;
}

Assistant:

int stlma_(double *x, int *n, int *len, double *ave)
{
    /* System generated locals */
    int i__1;

    /* Local variables */
    int i__, j, k, m;
    double v, flen;
    int newn;

/* Moving Average (aka "running mean") */
/* ave(i) := mean(x{j}, j = max(1,i-k),..., min(n, i+k)) */
/*           for i = 1,2,..,n */
/* Arg */
/* Var */
    /* Parameter adjustments */
    --ave;
    --x;

    /* Function Body */
    newn = *n - *len + 1;
    flen = (double) (*len);
    v = 0.0;
    i__1 = *len;
    for (i__ = 1; i__ <= i__1; ++i__) {
	v += x[i__];
/* L3: */
    }
    ave[1] = v / flen;
    if (newn > 1) {
	k = *len;
	m = 0;
	i__1 = newn;
	for (j = 2; j <= i__1; ++j) {
	    ++k;
	    ++m;
	    v = v - x[m] + x[k];
	    ave[j] = v / flen;
/* L7: */
	}
    }
    return 0;
}